

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_DeinitConsole(void)

{
  GameAtExit *pGVar1;
  History *pHVar2;
  FBaseCVar *pFVar3;
  FConsoleCommand *pFVar4;
  FConsoleBuffer *pFVar5;
  int iVar6;
  char *cmd;
  FBaseCVar **ppFVar7;
  FConsoleCommand *pFVar8;
  size_t i;
  GameAtExit *pGVar9;
  History *pHVar10;
  FBaseCVar *pFVar11;
  long lVar12;
  
  pGVar9 = ExitCmdList;
  while (pHVar10 = HistTail, pGVar9 != (GameAtExit *)0x0) {
    pGVar1 = pGVar9->Next;
    cmd = FString::LockBuffer(&pGVar9->Command);
    AddCommandString(cmd,0);
    FString::~FString(&pGVar9->Command);
    operator_delete(pGVar9,0x10);
    pGVar9 = pGVar1;
  }
  while (pHVar10 != (History *)0x0) {
    pHVar2 = pHVar10->Newer;
    FString::~FString(&pHVar10->String);
    operator_delete(pHVar10,0x18);
    pHVar10 = pHVar2;
  }
  HistPos = (History *)0x0;
  HistHead = (History *)0x0;
  HistTail = (History *)0x0;
  ppFVar7 = &CVars;
  pFVar11 = CVars;
  while (pFVar11 != (FBaseCVar *)0x0) {
    pFVar3 = pFVar11->m_Next;
    if ((pFVar11->Flags & 0x20) == 0) {
      ppFVar7 = &pFVar11->m_Next;
      pFVar11 = pFVar3;
    }
    else {
      (*pFVar11->_vptr_FBaseCVar[1])();
      *ppFVar7 = pFVar3;
      pFVar11 = pFVar3;
    }
  }
  for (lVar12 = 0; lVar12 != 0xfb; lVar12 = lVar12 + 1) {
    pFVar4 = Commands[lVar12];
    while (pFVar8 = pFVar4, pFVar8 != (FConsoleCommand *)0x0) {
      pFVar4 = pFVar8->m_Next;
      iVar6 = (*pFVar8->_vptr_FConsoleCommand[2])(pFVar8);
      if ((char)iVar6 != '\0') {
        (*pFVar8->_vptr_FConsoleCommand[1])(pFVar8);
      }
    }
  }
  C_ClearTabCommands();
  pFVar5 = conbuffer;
  if (conbuffer != (FConsoleBuffer *)0x0) {
    FConsoleBuffer::~FConsoleBuffer(conbuffer);
    operator_delete(pFVar5,0x68);
    conbuffer = (FConsoleBuffer *)0x0;
  }
  return;
}

Assistant:

void C_DeinitConsole ()
{
	GameAtExit *cmd = ExitCmdList;

	while (cmd != NULL)
	{
		GameAtExit *next = cmd->Next;
		AddCommandString (cmd->Command.LockBuffer());
		delete cmd;
		cmd = next;
	}

	// Free command history
	History *hist = HistTail;

	while (hist != NULL)
	{
		History *next = hist->Newer;
		delete hist;
		hist = next;
	}
	HistTail = HistHead = HistPos = NULL;

	// Free cvars allocated at runtime
	FBaseCVar *var, *next, **nextp;
	for (var = CVars, nextp = &CVars; var != NULL; var = next)
	{
		next = var->m_Next;
		if (var->GetFlags() & CVAR_UNSETTABLE)
		{
			delete var;
			*nextp = next;
		}
		else
		{
			nextp = &var->m_Next;
		}
	}

	// Free alias commands. (i.e. The "commands" that can be allocated
	// at runtime.)
	for (size_t i = 0; i < countof(Commands); ++i)
	{
		FConsoleCommand *cmd = Commands[i];

		while (cmd != NULL)
		{
			FConsoleCommand *next = cmd->m_Next;
			if (cmd->IsAlias())
			{
				delete cmd;
			}
			cmd = next;
		}
	}

	// Make sure all tab commands are cleared before the memory for
	// their names is deallocated.
	C_ClearTabCommands ();

	// Free AddToConsole()'s work buffer
	if (work != NULL)
	{
		free (work);
		work = NULL;
		worklen = 0;
	}

	if (conbuffer != NULL)
	{
		delete conbuffer;
		conbuffer = NULL;
	}
}